

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O2

void test_bhdct_get_nonexist_many(planck_unit_test_t *tc)

{
  undefined4 local_88;
  undefined4 local_84;
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  
  bhdct_setup(tc,&handler,&dict,ion_fill_edge_cases);
  local_84 = 0xfffff830;
  bhdct_get(tc,&dict,&local_84,(ion_value_t)0x0,'\x01',0);
  local_88 = 3000;
  bhdct_get(tc,&dict,&local_88,(ion_value_t)0x0,'\x01',0);
  bhdct_takedown(tc,&dict);
  return;
}

Assistant:

void
test_bhdct_get_nonexist_many(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_edge_cases);

	bhdct_get(tc, &dict, IONIZE(-2000, int), NULL, err_item_not_found, 0);
	bhdct_get(tc, &dict, IONIZE(3000, int), NULL, err_item_not_found, 0);

	bhdct_takedown(tc, &dict);
}